

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_value.h
# Opt level: O0

void __thiscall
isocpp_p1950::indirect_value<int,_CopierWithCallback,_std::default_delete<int>_>::indirect_value
          (indirect_value<int,_CopierWithCallback,_std::default_delete<int>_> *this,
          indirect_value<int,_CopierWithCallback,_std::default_delete<int>_> *i)

{
  CopierWithCallback *c;
  default_delete<int> *d;
  int *piVar1;
  indirect_value<int,_CopierWithCallback,_std::default_delete<int>_> *i_local;
  indirect_value<int,_CopierWithCallback,_std::default_delete<int>_> *this_local;
  
  c = get_c(i);
  indirect_value_copy_base<CopierWithCallback,_false>::indirect_value_copy_base
            (&this->super_indirect_value_copy_base<CopierWithCallback,_false>,c);
  d = get_d(i);
  indirect_value_delete_base<std::default_delete<int>,_true>::indirect_value_delete_base
            ((indirect_value_delete_base<std::default_delete<int>,_true> *)this,d);
  piVar1 = make_raw_copy(i);
  this->ptr_ = piVar1;
  return;
}

Assistant:

constexpr indirect_value(const indirect_value& i)
      : copy_base(i.get_c()), delete_base(i.get_d()), ptr_(i.make_raw_copy()) {}